

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsCompare.c
# Opt level: O0

void JsEqualityExpressionEqCompare(JsValue *x,JsValue *y,JsValue *res)

{
  JsValueEnum JVar1;
  JsValueEnum JVar2;
  int iVar3;
  uint local_44;
  int hit;
  int ytype;
  int xtype;
  JsValue tmp;
  JsValue *res_local;
  JsValue *y_local;
  JsValue *x_local;
  
  res->type = JS_BOOLEAN;
  tmp.u.reference.name = (char *)res;
  if (x->type == y->type) {
    switch(x->type) {
    case JS_UNDEFINED:
    case JS_NULL:
      (res->u).boolean = 1;
      break;
    case JS_BOOLEAN:
      *(uint *)&res->u = (uint)((x->u).boolean == (y->u).boolean);
      break;
    case JS_NUMBER:
      if ((NAN((x->u).number)) || (NAN((y->u).number))) {
        (res->u).boolean = 0;
      }
      else {
        *(uint *)&res->u = (uint)((x->u).number == (y->u).number);
      }
      break;
    case JS_STRING:
      iVar3 = strcmp((x->u).string,(y->u).string);
      *(uint *)(tmp.u.reference.name + 8) = (uint)(iVar3 == 0);
      break;
    case JS_OBJECT:
      *(uint *)&res->u = (uint)((x->u).object == (y->u).object);
      break;
    default:
      JsAssert(0);
      goto LAB_0011cffd;
    }
  }
  else {
LAB_0011cffd:
    JVar1 = x->type;
    JVar2 = y->type;
    if ((JVar1 == JS_NULL) && (JVar2 == JS_UNDEFINED)) {
      *(tmp.u._8_8_ + 8) = '\x01';
      *(tmp.u._8_8_ + 9) = '\0';
      *(tmp.u._8_8_ + 10) = '\0';
      *(tmp.u._8_8_ + 0xb) = '\0';
    }
    else if ((JVar1 == JS_UNDEFINED) && (JVar2 == JS_NULL)) {
      *(tmp.u._8_8_ + 8) = '\x01';
      *(tmp.u._8_8_ + 9) = '\0';
      *(tmp.u._8_8_ + 10) = '\0';
      *(tmp.u._8_8_ + 0xb) = '\0';
    }
    else if ((JVar1 == JS_NUMBER) && (JVar2 == JS_STRING)) {
      JsToNumber(y,(JsValue *)&ytype);
      JsEqualityExpressionEqCompare(x,(JsValue *)&ytype,(JsValue *)tmp.u.reference.name);
    }
    else if ((JVar1 == JS_STRING) && (JVar2 == JS_NUMBER)) {
      JsToNumber(x,(JsValue *)&ytype);
      JsEqualityExpressionEqCompare((JsValue *)&ytype,y,(JsValue *)tmp.u.reference.name);
    }
    else if (JVar1 == JS_BOOLEAN) {
      JsToNumber(x,(JsValue *)&ytype);
      JsEqualityExpressionEqCompare((JsValue *)&ytype,y,(JsValue *)tmp.u.reference.name);
    }
    else if (JVar2 == JS_BOOLEAN) {
      JsToNumber(y,(JsValue *)&ytype);
      JsEqualityExpressionEqCompare(x,(JsValue *)&ytype,(JsValue *)tmp.u.reference.name);
    }
    else if (((JVar1 == JS_STRING) || (JVar1 == JS_NUMBER)) && (JVar2 == JS_OBJECT)) {
      local_44 = (uint)(JVar1 != JS_STRING);
      JsToPrimitive(y,local_44,(JsValue *)&ytype);
      JsEqualityExpressionEqCompare(x,(JsValue *)&ytype,(JsValue *)tmp.u.reference.name);
    }
    else if (((JVar2 == JS_STRING) || (JVar2 == JS_NUMBER)) && (JVar1 == JS_OBJECT)) {
      local_44 = (uint)(JVar2 != JS_STRING);
      JsToPrimitive(x,local_44,(JsValue *)&ytype);
      JsEqualityExpressionEqCompare((JsValue *)&ytype,y,(JsValue *)tmp.u.reference.name);
    }
    else {
      *(tmp.u._8_8_ + 8) = '\0';
      *(tmp.u._8_8_ + 9) = '\0';
      *(tmp.u._8_8_ + 10) = '\0';
      *(tmp.u._8_8_ + 0xb) = '\0';
    }
  }
  return;
}

Assistant:

void JsEqualityExpressionEqCompare( struct JsValue *x, struct JsValue *y, 
		struct JsValue *res){
	struct JsValue tmp;
	int xtype, ytype;
	int hit;
	res->type = JS_BOOLEAN;
	if (x->type == y->type)
		switch (x->type){
		case JS_UNDEFINED:
		case JS_NULL:
			res->u.boolean = TRUE;
			return;
		case JS_NUMBER:
			if (isnan(x->u.number) || isnan(y->u.number))
				res->u.boolean = FALSE;
			else
				res->u.boolean =  (x->u.number == y->u.number ? TRUE : FALSE);
			return;
		case JS_STRING:
			res->u.boolean = (strcmp(x->u.string,y->u.string) == 0 ? TRUE: FALSE);
			return;
		case JS_BOOLEAN:
			res->u.boolean = (x->u.boolean == y->u.boolean ? TRUE : FALSE);
			return;
		case JS_OBJECT:
			//refer the same object
			res->u.boolean = (x->u.object == y->u.object ? TRUE: FALSE);
			return;
		default:
			//未发现正确的类型
			JsAssert(FALSE);
		}
	xtype = x->type;
	ytype = y->type;
	if (xtype == JS_NULL && ytype == JS_UNDEFINED)
			res->u.boolean = TRUE;
	else if (xtype == JS_UNDEFINED && ytype == JS_NULL)
			res->u.boolean = TRUE;
	else if (xtype == JS_NUMBER && ytype == JS_STRING) {
			JsToNumber(y, &tmp);
			JsEqualityExpressionEqCompare(x, &tmp, res);
	} else if (xtype == JS_STRING && ytype == JS_NUMBER) {
			JsToNumber(x, &tmp);
			JsEqualityExpressionEqCompare(&tmp, y, res);
	} else if (xtype == JS_BOOLEAN) {
			JsToNumber( x, &tmp);
			JsEqualityExpressionEqCompare(&tmp, y, res);
	} else if (ytype == JS_BOOLEAN){
			JsToNumber(y, &tmp);
			JsEqualityExpressionEqCompare(x, &tmp, res);
	} else if ((xtype == JS_STRING || xtype == JS_NUMBER) &&
				ytype == JS_OBJECT) {
			if(xtype == JS_STRING)
				hit = JS_OBJECT_HIT_TYPE_STRING;
			else
				hit = JS_OBJECT_HIT_TYPE_NUMBER;
				
			JsToPrimitive(y, hit, &tmp);
			JsEqualityExpressionEqCompare(x, &tmp, res);
	} else if ((ytype == JS_STRING || ytype == JS_NUMBER) &&
				xtype == JS_OBJECT){
				
			if(ytype == JS_STRING)
				hit = JS_OBJECT_HIT_TYPE_STRING;
			else
				hit = JS_OBJECT_HIT_TYPE_NUMBER;
				
			JsToPrimitive(x, hit, &tmp);
			JsEqualityExpressionEqCompare(&tmp, y, res);
	} else{
		res->u.boolean  = FALSE;
	}
}